

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O0

int read_array(coda_cursor_conflict *cursor,void *dst)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  size_t __n;
  int local_3c;
  coda_endianness system_endianness;
  int i;
  long record_size;
  coda_type_class type_class;
  coda_cdf_variable *variable;
  void *dst_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  __n = (size_t)(int)(*(int *)((long)&pcVar1[2].definition + 4) * pcVar1[3].backend);
  if (pcVar1[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0xd7,"int read_array(const coda_cursor *, void *)");
  }
  if (*(long *)(pcVar1 + 2) == 0) {
    record_size._4_4_ = pcVar1->definition->type_class;
  }
  else {
    record_size._4_4_ = *(coda_type_class *)(*(long *)(*(long *)(pcVar1 + 2) + 8) + 8);
  }
  local_3c = 0;
  while( true ) {
    if (*(int *)&pcVar1[2].definition <= local_3c) {
      if ((record_size._4_4_ != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
        switch(pcVar1[3].backend) {
        case coda_backend_binary:
          break;
        case 2:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap2((void *)((long)dst + (long)local_3c * 2));
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                        ,0x116,"int read_array(const coda_cursor *, void *)");
        case 4:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap4((void *)((long)dst + (long)local_3c * 4));
          }
          break;
        case 8:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap8((void *)((long)dst + (long)local_3c * 8));
          }
        }
      }
      return 0;
    }
    if (*(long *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8) < 0) break;
    if (pcVar1[4].definition == (coda_type *)0x0) {
      iVar2 = read_bytes((coda_product *)cursor->product[1].filename,
                         *(int64_t *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8),__n,
                         (void *)((long)dst + (long)local_3c * __n));
      if (iVar2 != 0) {
        return -1;
      }
    }
    else {
      memcpy((void *)((long)dst + (long)local_3c * __n),
             (void *)((long)&(pcVar1[4].definition)->format +
                     *(long *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8)),__n);
    }
    local_3c = local_3c + 1;
  }
  coda_set_error(-200,"Missing record not supported for CDF variable");
  return -1;
}

Assistant:

static int read_array(const coda_cursor *cursor, void *dst)
{
    coda_cdf_variable *variable = (coda_cdf_variable *)cursor->stack[cursor->n - 1].type;
    coda_type_class type_class;
    long record_size = variable->num_values_per_record * variable->value_size;
    int i;

    assert(variable->tag == tag_cdf_variable);
    if (variable->base_type == NULL)
    {
        type_class = variable->definition->type_class;
    }
    else
    {
        type_class = variable->base_type->definition->type_class;
    }

    for (i = 0; i < variable->num_records; i++)
    {
        /* TODO: handle sparse records */
        if (variable->offset[i] < 0)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Missing record not supported for CDF variable");
            return -1;
        }
        if (variable->data != NULL)
        {
            memcpy(&((uint8_t *)dst)[i * record_size], &variable->data[variable->offset[i]], record_size);
        }
        else
        {
            if (read_bytes(((coda_cdf_product *)cursor->product)->raw_product, variable->offset[i], record_size,
                           &((uint8_t *)dst)[i * record_size]) != 0)
            {
                return -1;
            }
        }
    }
    if (type_class != coda_text_class)
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness system_endianness = coda_big_endian;
#else
        coda_endianness system_endianness = coda_little_endian;
#endif
        if (((coda_cdf_product *)cursor->product)->endianness != system_endianness)
        {
            switch (variable->value_size)
            {
                case 1:
                    break;
                case 2:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap2(&((int16_t *)dst)[i]);
                    }
                    break;
                case 4:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap4(&((int32_t *)dst)[i]);
                    }
                    break;
                case 8:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap8(&((int64_t *)dst)[i]);
                    }
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
    }

    return 0;
}